

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLocalDecl
          (BinaryReaderInterp *this,Index decl_index,Index count,Type type)

{
  pointer *ppLVar1;
  FuncDesc *pFVar2;
  iterator __position;
  Result RVar3;
  Enum EVar4;
  u32 uVar5;
  Location loc;
  Location local_38;
  
  local_38.field_1.field_0.last_column = 0;
  local_38.filename._M_len = (this->filename_)._M_len;
  local_38.filename._M_str = (this->filename_)._M_str;
  local_38.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar3 = SharedValidator::OnLocalDecl(&this->validator_,&local_38,count,type);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    uVar5 = this->local_count_ + count;
    this->local_count_ = uVar5;
    pFVar2 = this->func_;
    local_38.filename._M_str = (char *)CONCAT44(uVar5,count);
    __position._M_current =
         (pFVar2->locals).
         super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar2->locals).
        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_38.filename._M_len = (size_t)type;
      std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::
      _M_realloc_insert<wabt::interp::LocalDesc>(&pFVar2->locals,__position,(LocalDesc *)&local_38);
    }
    else {
      ((__position._M_current)->type).enum_ = type.enum_;
      ((__position._M_current)->type).type_index_ = type.type_index_;
      *(char **)&(__position._M_current)->count = local_38.filename._M_str;
      ppLVar1 = &(pFVar2->locals).
                 super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + 1;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnLocalDecl(Index decl_index,
                                       Index count,
                                       Type type) {
  CHECK_RESULT(validator_.OnLocalDecl(GetLocation(), count, type));

  local_count_ += count;
  func_->locals.push_back(LocalDesc{type, count, local_count_});
  return Result::Ok;
}